

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall
embree::SceneGraph::GridMeshNode::calculateStatistics(GridMeshNode *this,Statistics *stat)

{
  MaterialNode *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  long in_RSI;
  GridMeshNode *in_RDI;
  GridMeshNode *this_00;
  
  (in_RDI->super_Node).indegree = (in_RDI->super_Node).indegree + 1;
  if ((in_RDI->super_Node).indegree == 1) {
    *(long *)(in_RSI + 0x60) = *(long *)(in_RSI + 0x60) + 1;
    this_00 = in_RDI;
    iVar2 = (*(in_RDI->super_Node).super_RefCount._vptr_RefCount[0xe])();
    *(long *)(in_RSI + 0x68) = CONCAT44(extraout_var,iVar2) + *(long *)(in_RSI + 0x68);
    sVar3 = numBytes(this_00);
    *(size_t *)(in_RSI + 0x70) = sVar3 + *(long *)(in_RSI + 0x70);
    pMVar1 = (in_RDI->material).ptr;
    (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[9])(pMVar1,in_RSI);
  }
  return;
}

Assistant:

void SceneGraph::GridMeshNode::calculateStatistics(Statistics& stat)
  {
    indegree++;
    if (indegree == 1) {
      stat.numGridMeshNodes++;
      stat.numGrids += numPrimitives();
      stat.numGridBytes += numBytes();
      material->calculateStatistics(stat);
    }
  }